

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall
Liby::Connection::sendFile(Connection *this,fdPtr *fp,off_t off,off_t len,BasicHandler *handler)

{
  Channel *this_00;
  _Head_base<0UL,_std::function<void_()>_*,_false> __ptr;
  _Head_base<0UL,_std::function<void_()>_*,_false> this_01;
  bool bVar1;
  undefined1 local_60 [48];
  _Head_base<0UL,_std::function<void_()>_*,_false> _Stack_30;
  
  local_60._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_30._M_head_impl = (function<void_()> *)0x0;
  local_60._24_8_ = 0;
  local_60._32_8_ = (element_type *)0x0;
  local_60._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60._16_8_ = 0;
  local_60._0_8_ = (fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8),
             &(fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            );
  local_60._16_8_ = off;
  local_60._24_8_ = len;
  if ((handler->super__Function_base)._M_manager != (_Manager_type)0x0) {
    this_01._M_head_impl = (function<void_()> *)operator_new(0x20);
    std::function<void_()>::function(this_01._M_head_impl,handler);
    __ptr._M_head_impl = _Stack_30._M_head_impl;
    bVar1 = _Stack_30._M_head_impl != (function<void_()> *)0x0;
    _Stack_30._M_head_impl = this_01._M_head_impl;
    if (bVar1) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&_Stack_30,__ptr._M_head_impl);
    }
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,(io_task *)local_60);
  this_00 = (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00->writable_ = true;
  Channel::updateChannel(this_00);
  if (_Stack_30._M_head_impl != (function<void_()> *)0x0) {
    std::default_delete<std::function<void_()>_>::operator()
              ((default_delete<std::function<void_()>_> *)&_Stack_30,_Stack_30._M_head_impl);
  }
  _Stack_30._M_head_impl = (function<void_()> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._40_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  return;
}

Assistant:

void Connection::sendFile(const fdPtr &fp, off_t off, off_t len,
                          const BasicHandler &handler) {
    io_task task;
    task.fp_ = fp;
    task.offset_ = off;
    task.len_ = len;
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}